

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O1

bool deqp::egl::SurfaceConfig::compareColorBufferBits
               (SurfaceConfig *a,SurfaceConfig *b,BVec4 *specifiedRGBColors,
               BVec2 *specifiedLuminanceColors,bool yuvPlaneBppSpecified)

{
  deUint32 dVar1;
  int iVar2;
  int i;
  long lVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  IVec4 mask;
  
  dVar1 = (a->m_info).colorBufferType;
  if (dVar1 == 0x3300) {
    return (b->m_info).yuvPlaneBpp < (a->m_info).yuvPlaneBpp && yuvPlaneBppSpecified;
  }
  if (dVar1 == 0x308f) {
    mask.m_data[0] = 0;
    mask.m_data[1] = 0;
    lVar3 = 0;
    do {
      mask.m_data[lVar3] = (uint)specifiedLuminanceColors->m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    iVar5 = (a->m_info).alphaSize * mask.m_data[1] + (a->m_info).luminanceSize * mask.m_data[0];
    iVar4 = mask.m_data[1] * (b->m_info).alphaSize + mask.m_data[0] * (b->m_info).luminanceSize;
    bVar7 = SBORROW4(iVar5,iVar4);
    iVar2 = iVar5 - iVar4;
    bVar6 = iVar5 == iVar4;
  }
  else {
    if (dVar1 != 0x308e) {
      return true;
    }
    mask.m_data[0] = 0;
    mask.m_data[1] = 0;
    mask.m_data[2] = 0;
    mask.m_data[3] = 0;
    lVar3 = 0;
    do {
      mask.m_data[lVar3] = (uint)specifiedRGBColors->m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    iVar4 = (a->m_info).alphaSize * mask.m_data[3] + (a->m_info).blueSize * mask.m_data[2] +
            (a->m_info).greenSize * mask.m_data[1] + (a->m_info).redSize * mask.m_data[0];
    iVar5 = mask.m_data[3] * (b->m_info).alphaSize + mask.m_data[2] * (b->m_info).blueSize +
            mask.m_data[1] * (b->m_info).greenSize + mask.m_data[0] * (b->m_info).redSize;
    bVar7 = SBORROW4(iVar4,iVar5);
    iVar2 = iVar4 - iVar5;
    bVar6 = iVar4 == iVar5;
  }
  return !bVar6 && bVar7 == iVar2 < 0;
}

Assistant:

static bool compareColorBufferBits (const SurfaceConfig& a, const SurfaceConfig& b, const tcu::BVec4& specifiedRGBColors, const tcu::BVec2& specifiedLuminanceColors, bool yuvPlaneBppSpecified)
	{
		DE_ASSERT(a.m_info.colorBufferType == b.m_info.colorBufferType);
		switch (a.m_info.colorBufferType)
		{
			case EGL_RGB_BUFFER:
			{
				const tcu::IVec4	mask	(specifiedRGBColors.cast<deInt32>());

				return (a.m_info.redSize * mask[0] + a.m_info.greenSize * mask[1] + a.m_info.blueSize * mask[2] + a.m_info.alphaSize * mask[3])
						> (b.m_info.redSize * mask[0] + b.m_info.greenSize * mask[1] + b.m_info.blueSize * mask[2] + b.m_info.alphaSize * mask[3]);
			}

			case EGL_LUMINANCE_BUFFER:
			{
				const tcu::IVec2	mask	(specifiedLuminanceColors.cast<deInt32>());

				return (a.m_info.luminanceSize * mask[0] + a.m_info.alphaSize * mask[1]) > (b.m_info.luminanceSize * mask[0] + b.m_info.alphaSize * mask[1]);
			}

			case EGL_YUV_BUFFER_EXT:
				return yuvPlaneBppSpecified ? (a.m_info.yuvPlaneBpp > b.m_info.yuvPlaneBpp) : false;

			default:
				DE_ASSERT(DE_FALSE);
				return true;
		}
	}